

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::CloseCurrentPopup(void)

{
  uint uVar1;
  uint uVar2;
  ImGuiPopupData *pIVar3;
  ImGuiContext *pIVar4;
  uint uVar5;
  uint uVar6;
  uint remaining;
  ImGuiWindow **ppIVar7;
  
  pIVar4 = GImGui;
  uVar6 = (GImGui->BeginPopupStack).Size;
  if ((0 < (int)uVar6) && (uVar2 = (GImGui->OpenPopupStack).Size, (int)uVar6 <= (int)uVar2)) {
    uVar5 = uVar6 - 1;
    pIVar3 = (GImGui->OpenPopupStack).Data;
    if ((GImGui->BeginPopupStack).Data[uVar5].PopupId == pIVar3[uVar5].PopupId) {
      remaining = 0;
      if (uVar6 != 1) {
        ppIVar7 = &pIVar3[uVar6 - 2].Window;
        while( true ) {
          uVar1 = uVar6 - 1;
          if (uVar2 <= uVar1) {
            __assert_fail("i < Size",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                          ,0x4e6,"T &ImVector<ImGuiPopupData>::operator[](int) [T = ImGuiPopupData]"
                         );
          }
          if (pIVar3[uVar1].Window == (ImGuiWindow *)0x0) break;
          remaining = uVar5;
          if ((((pIVar3[uVar1].Window)->Flags & 0x10000000) == 0) ||
             ((*ppIVar7 != (ImGuiWindow *)0x0 && (((*ppIVar7)->Flags & 0x8000000) != 0))))
          goto LAB_0011c463;
          ppIVar7 = ppIVar7 + -6;
          uVar5 = uVar5 - 1;
          uVar6 = uVar1;
          remaining = 0;
          if (uVar1 < 2) goto LAB_0011c463;
        }
        remaining = uVar6 - 1;
      }
LAB_0011c463:
      ClosePopupToLevel(remaining,true);
      if (pIVar4->NavWindow != (ImGuiWindow *)0x0) {
        (pIVar4->NavWindow->DC).NavHideHighlightOneFrame = true;
      }
    }
  }
  return;
}

Assistant:

void ImGui::CloseCurrentPopup()
{
    ImGuiContext& g = *GImGui;
    int popup_idx = g.BeginPopupStack.Size - 1;
    if (popup_idx < 0 || popup_idx >= g.OpenPopupStack.Size || g.BeginPopupStack[popup_idx].PopupId != g.OpenPopupStack[popup_idx].PopupId)
        return;

    // Closing a menu closes its top-most parent popup (unless a modal)
    while (popup_idx > 0)
    {
        ImGuiWindow* popup_window = g.OpenPopupStack[popup_idx].Window;
        ImGuiWindow* parent_popup_window = g.OpenPopupStack[popup_idx - 1].Window;
        bool close_parent = false;
        if (popup_window && (popup_window->Flags & ImGuiWindowFlags_ChildMenu))
            if (parent_popup_window == NULL || !(parent_popup_window->Flags & ImGuiWindowFlags_Modal))
                close_parent = true;
        if (!close_parent)
            break;
        popup_idx--;
    }
    //IMGUI_DEBUG_LOG("CloseCurrentPopup %d -> %d\n", g.BeginPopupStack.Size - 1, popup_idx);
    ClosePopupToLevel(popup_idx, true);

    // A common pattern is to close a popup when selecting a menu item/selectable that will open another window.
    // To improve this usage pattern, we avoid nav highlight for a single frame in the parent window.
    // Similarly, we could avoid mouse hover highlight in this window but it is less visually problematic.
    if (ImGuiWindow* window = g.NavWindow)
        window->DC.NavHideHighlightOneFrame = true;
}